

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void int_rel(IntVar *x,IntRelType t,int c)

{
  char cVar1;
  BoolView *in_RCX;
  IntVar *y;
  IntRelType t_00;
  ulong uVar3;
  ulong in_R8;
  long lVar4;
  ulong uVar5;
  IntView<0> x_00;
  IntView<0> x_01;
  IntView<0> x_02;
  IntView<0> x_03;
  IntView<0> x_04;
  IntView<0> x_05;
  IntView<0> y_00;
  IntView<0> y_01;
  IntView<0> y_02;
  IntView<0> y_03;
  IntView<0> y_04;
  IntView<0> y_05;
  undefined1 auStack_80 [24];
  undefined8 uStack_68;
  BoolView BStack_60;
  IRR local_20;
  int iVar2;
  
  uVar3 = (ulong)t;
  switch(t) {
  case IRT_EQ:
    if (((x->min).v == c) && ((x->max).v == c)) {
      return;
    }
    iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0x10])(x,(long)c,0,1);
    cVar1 = (char)iVar2;
    goto LAB_001b09e0;
  case IRT_NE:
    local_20.r.s = bv_true.s;
    local_20.r.v = bv_true.v;
    local_20.t = IRT_NE;
    local_20.r.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_20.x = x;
    local_20.c = c;
    vec<IRR>::push(&ircs,&local_20);
    return;
  case IRT_LE:
    if ((x->max).v <= c) {
      return;
    }
    break;
  case IRT_LT:
    if ((x->max).v < c) {
      return;
    }
    c = c + -1;
    break;
  case IRT_GE:
    if (c <= (x->min).v) {
      return;
    }
    goto LAB_001b09d0;
  case IRT_GT:
    if (c < (x->min).v) {
      return;
    }
    c = c + 1;
LAB_001b09d0:
    iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0xe])(x,(long)c,0,1);
    cVar1 = (char)iVar2;
    goto LAB_001b09e0;
  default:
    int_rel();
    auStack_80._8_4_ = (undefined4)uVar3;
    if (IRT_GT < (uint)auStack_80._8_4_) {
      uStack_68 = int_rel_half_reif;
      int_rel_reif();
      uStack_68._4_1_ = in_RCX->s;
      uStack_68._0_4_ = in_RCX->v;
      auStack_80._16_8_ = &PTR_finished_0020bb98;
      auStack_80._0_8_ = x;
      vec<IRR>::push(&ihrcs,(IRR *)auStack_80);
      return;
    }
    uVar5 = in_R8 & 0xffffffff;
    iVar2 = (int)in_R8;
    switch(uVar3 & 0xffffffff) {
    case 0:
      lVar4 = (uVar5 << 0x20) + 1;
      uStack_68._0_4_ = 0x1b0a63;
      uStack_68._4_1_ = false;
      uStack_68._5_3_ = 0;
      x_00.a = 1;
      x_00.b = 0;
      x_00.var = x;
      y_00._8_8_ = lVar4;
      y_00.var = y;
      newBinGE(x_00,y_00,in_RCX);
      uStack_68._0_4_ = 0x1b0a83;
      uStack_68._4_1_ = false;
      uStack_68._5_3_ = 0;
      x_01.a = 1;
      x_01.b = 0;
      x_01.var = y;
      y_01._8_8_ = ((ulong)(uint)-iVar2 << 0x20) + 1;
      y_01.var = x;
      newBinGE(x_01,y_01,in_RCX);
      BStack_60.v = in_RCX->v;
      BStack_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_60.s = (bool)(in_RCX->s ^ 1);
      uStack_68._0_4_ = 0x1b0abc;
      uStack_68._4_1_ = false;
      uStack_68._5_3_ = 0;
      x_02.a = 1;
      x_02.b = 0;
      x_02.var = x;
      y_02._8_8_ = lVar4;
      y_02.var = y;
      newBinNE(x_02,y_02,&BStack_60);
      return;
    case 1:
      BStack_60.v = in_RCX->v;
      BStack_60.s = (bool)(in_RCX->s ^ 1);
      t_00 = IRT_EQ;
      break;
    case 2:
      y_03._8_8_ = ((ulong)(uint)-iVar2 << 0x20) + 1;
      uStack_68._0_4_ = 0x1b0b11;
      uStack_68._4_1_ = false;
      uStack_68._5_3_ = 0;
      x_03.a = 1;
      x_03.b = 0;
      x_03.var = y;
      y_03.var = x;
      newBinGE(x_03,y_03,in_RCX);
      uVar5 = (ulong)(iVar2 + 1);
      goto LAB_001b0b38;
    case 3:
      y_04._8_8_ = ((ulong)(1 - iVar2) << 0x20) + 1;
      uStack_68._0_4_ = 0x1b0b38;
      uStack_68._4_1_ = false;
      uStack_68._5_3_ = 0;
      x_04.a = 1;
      x_04.b = 0;
      x_04.var = y;
      y_04.var = x;
      newBinGE(x_04,y_04,in_RCX);
LAB_001b0b38:
      BStack_60.v = in_RCX->v;
      BStack_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_60.s = (bool)(in_RCX->s ^ 1);
      uStack_68._0_4_ = 0x1b0b78;
      uStack_68._4_1_ = false;
      uStack_68._5_3_ = 0;
      x_05.a = 1;
      x_05.b = 0;
      x_05.var = x;
      y_05._8_8_ = (uVar5 << 0x20) + 1;
      y_05.var = y;
      newBinGE(x_05,y_05,&BStack_60);
      return;
    case 4:
      BStack_60.v = in_RCX->v;
      BStack_60.s = (bool)(in_RCX->s ^ 1);
      t_00 = IRT_LT;
      break;
    case 5:
      BStack_60.v = in_RCX->v;
      BStack_60.s = (bool)(in_RCX->s ^ 1);
      t_00 = IRT_LE;
    }
    BStack_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    uStack_68._0_4_ = 0x1b0bdc;
    uStack_68._4_1_ = false;
    uStack_68._5_3_ = 0;
    int_rel_reif(x,t_00,y,&BStack_60,iVar2);
    return;
  }
  iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0xf])(x,(long)c,0,1);
  cVar1 = (char)iVar2;
LAB_001b09e0:
  if (cVar1 != '\0') {
    return;
  }
  puts("=====UNSATISFIABLE=====");
  printf("%% Top level failure!\n");
  exit(0);
}

Assistant:

void int_rel(IntVar* x, IntRelType t, int c) {
	switch (t) {
		case IRT_EQ:
			TL_SET(x, setVal, c);
			break;
		case IRT_NE:
			ircs.push(IRR(x, t, c, bv_true));
			break;
		case IRT_LE:
			TL_SET(x, setMax, c);
			break;
		case IRT_LT:
			TL_SET(x, setMax, c - 1);
			break;
		case IRT_GE:
			TL_SET(x, setMin, c);
			break;
		case IRT_GT:
			TL_SET(x, setMin, c + 1);
			break;
		default:
			NEVER;
	}
}